

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cc
# Opt level: O0

bool __thiscall Minisat::SimpSolver::eliminateVar(SimpSolver *this,Var v)

{
  Var VVar1;
  bool bVar2;
  Size SVar3;
  int iVar4;
  Size SVar5;
  Lit p;
  char *pcVar6;
  vec<unsigned_int,_int> *pvVar7;
  uint *puVar8;
  Clause *pCVar9;
  Clause *pCVar10;
  vec<Minisat::Solver::Watcher,_int> *pvVar11;
  vec<unsigned_int,_int> *local_e8;
  Lit local_ac;
  int local_a8;
  Lit local_a4;
  Lit local_a0;
  Lit local_9c;
  int local_98;
  int local_94;
  int j_1;
  int i_5;
  vec<Minisat::Lit,_int> *resolvent;
  int i_4;
  int local_7c;
  int local_78;
  int i_3;
  undefined4 local_70;
  int i_2;
  int local_68;
  int j;
  int i_1;
  int clause_size;
  int cnt;
  int i;
  undefined1 local_48 [8];
  vec<unsigned_int,_int> neg;
  vec<unsigned_int,_int> pos;
  vec<unsigned_int,_int> *cls;
  SimpSolver *pSStack_18;
  Var v_local;
  SimpSolver *this_local;
  
  cls._4_4_ = v;
  pSStack_18 = this;
  pcVar6 = IntMap<int,_char,_Minisat::MkIndexDefault<int>_>::operator[]
                     (&(this->frozen).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>,v);
  if (*pcVar6 != '\0') {
    __assert_fail("!frozen[v]",
                  "/workspace/llm4binary/github/license_c_cmakelists/stp[P]minisat/minisat/simp/SimpSolver.cc"
                  ,0x1e7,"bool Minisat::SimpSolver::eliminateVar(Var)");
  }
  bVar2 = isEliminated(this,cls._4_4_);
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    __assert_fail("!isEliminated(v)",
                  "/workspace/llm4binary/github/license_c_cmakelists/stp[P]minisat/minisat/simp/SimpSolver.cc"
                  ,0x1e8,"bool Minisat::SimpSolver::eliminateVar(Var)");
  }
  cls._3_1_ = Solver::value(&this->super_Solver,cls._4_4_);
  cls._2_1_ = l_Undef.value;
  bVar2 = lbool::operator==((lbool *)((long)&cls + 3),l_Undef);
  if (!bVar2) {
    __assert_fail("value(v) == l_Undef",
                  "/workspace/llm4binary/github/license_c_cmakelists/stp[P]minisat/minisat/simp/SimpSolver.cc"
                  ,0x1e9,"bool Minisat::SimpSolver::eliminateVar(Var)");
  }
  pvVar7 = OccLists<int,_Minisat::vec<unsigned_int,_int>,_Minisat::SimpSolver::ClauseDeleted,_Minisat::MkIndexDefault<int>_>
           ::lookup(&this->occurs,(int *)((long)&cls + 4));
  vec<unsigned_int,_int>::vec((vec<unsigned_int,_int> *)&neg.sz);
  vec<unsigned_int,_int>::vec((vec<unsigned_int,_int> *)local_48);
  for (cnt = 0; iVar4 = cnt, SVar3 = vec<unsigned_int,_int>::size(pvVar7), iVar4 < SVar3;
      cnt = cnt + 1) {
    puVar8 = vec<unsigned_int,_int>::operator[](pvVar7,cnt);
    pCVar9 = ClauseAllocator::operator[](&(this->super_Solver).ca,*puVar8);
    clause_size = (int)mkLit(cls._4_4_,false);
    bVar2 = find<Minisat::Clause,Minisat::Lit>(pCVar9,(Lit *)&clause_size);
    if (bVar2) {
      local_e8 = (vec<unsigned_int,_int> *)&neg.sz;
    }
    else {
      local_e8 = (vec<unsigned_int,_int> *)local_48;
    }
    puVar8 = vec<unsigned_int,_int>::operator[](pvVar7,cnt);
    vec<unsigned_int,_int>::push(local_e8,puVar8);
  }
  i_1 = 0;
  j = 0;
  local_68 = 0;
  do {
    iVar4 = local_68;
    SVar3 = vec<unsigned_int,_int>::size((vec<unsigned_int,_int> *)&neg.sz);
    if (SVar3 <= iVar4) {
      pcVar6 = IntMap<int,_char,_Minisat::MkIndexDefault<int>_>::operator[]
                         (&(this->eliminated).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>
                          ,cls._4_4_);
      *pcVar6 = '\x01';
      Solver::setDecisionVar(&this->super_Solver,cls._4_4_,false);
      this->eliminated_vars = this->eliminated_vars + 1;
      SVar3 = vec<unsigned_int,_int>::size((vec<unsigned_int,_int> *)&neg.sz);
      SVar5 = vec<unsigned_int,_int>::size((vec<unsigned_int,_int> *)local_48);
      if (SVar5 < SVar3) {
        for (i_3 = 0; iVar4 = i_3,
            SVar3 = vec<unsigned_int,_int>::size((vec<unsigned_int,_int> *)local_48),
            VVar1 = cls._4_4_, iVar4 < SVar3; i_3 = i_3 + 1) {
          puVar8 = vec<unsigned_int,_int>::operator[]((vec<unsigned_int,_int> *)local_48,i_3);
          pCVar9 = ClauseAllocator::operator[](&(this->super_Solver).ca,*puVar8);
          mkElimClause(&this->elimclauses,VVar1,pCVar9);
        }
        local_78 = (int)mkLit(cls._4_4_,false);
        mkElimClause(&this->elimclauses,(Lit)local_78);
      }
      else {
        for (local_7c = 0; iVar4 = local_7c,
            SVar3 = vec<unsigned_int,_int>::size((vec<unsigned_int,_int> *)&neg.sz),
            VVar1 = cls._4_4_, iVar4 < SVar3; local_7c = local_7c + 1) {
          puVar8 = vec<unsigned_int,_int>::operator[]((vec<unsigned_int,_int> *)&neg.sz,local_7c);
          pCVar9 = ClauseAllocator::operator[](&(this->super_Solver).ca,*puVar8);
          mkElimClause(&this->elimclauses,VVar1,pCVar9);
        }
        resolvent._4_4_ = mkLit(cls._4_4_,false);
        i_4 = (int)operator~(resolvent._4_4_);
        mkElimClause(&this->elimclauses,(Lit)i_4);
      }
      for (resolvent._0_4_ = 0; iVar4 = (int)resolvent, SVar3 = vec<unsigned_int,_int>::size(pvVar7)
          , iVar4 < SVar3; resolvent._0_4_ = (int)resolvent + 1) {
        puVar8 = vec<unsigned_int,_int>::operator[](pvVar7,(int)resolvent);
        removeClause(this,*puVar8);
      }
      _j_1 = &(this->super_Solver).add_tmp;
      for (local_94 = 0; iVar4 = local_94,
          SVar3 = vec<unsigned_int,_int>::size((vec<unsigned_int,_int> *)&neg.sz), iVar4 < SVar3;
          local_94 = local_94 + 1) {
        for (local_98 = 0; iVar4 = local_98,
            SVar3 = vec<unsigned_int,_int>::size((vec<unsigned_int,_int> *)local_48), iVar4 < SVar3;
            local_98 = local_98 + 1) {
          puVar8 = vec<unsigned_int,_int>::operator[]((vec<unsigned_int,_int> *)&neg.sz,local_94);
          pCVar9 = ClauseAllocator::operator[](&(this->super_Solver).ca,*puVar8);
          puVar8 = vec<unsigned_int,_int>::operator[]((vec<unsigned_int,_int> *)local_48,local_98);
          pCVar10 = ClauseAllocator::operator[](&(this->super_Solver).ca,*puVar8);
          bVar2 = merge(this,pCVar9,pCVar10,cls._4_4_,_j_1);
          if ((bVar2) && (bVar2 = addClause_(this,_j_1), !bVar2)) {
            this_local._7_1_ = false;
            goto LAB_00120e2b;
          }
        }
      }
      pvVar7 = OccLists<int,_Minisat::vec<unsigned_int,_int>,_Minisat::SimpSolver::ClauseDeleted,_Minisat::MkIndexDefault<int>_>
               ::operator[](&this->occurs,(int *)((long)&cls + 4));
      vec<unsigned_int,_int>::clear(pvVar7,true);
      local_9c = mkLit(cls._4_4_,false);
      pvVar11 = OccLists<Minisat::Lit,_Minisat::vec<Minisat::Solver::Watcher,_int>,_Minisat::Solver::WatcherDeleted,_Minisat::MkIndexLit>
                ::operator[](&(this->super_Solver).watches,&local_9c);
      SVar3 = vec<Minisat::Solver::Watcher,_int>::size(pvVar11);
      if (SVar3 == 0) {
        local_a0 = mkLit(cls._4_4_,false);
        pvVar11 = OccLists<Minisat::Lit,_Minisat::vec<Minisat::Solver::Watcher,_int>,_Minisat::Solver::WatcherDeleted,_Minisat::MkIndexLit>
                  ::operator[](&(this->super_Solver).watches,&local_a0);
        vec<Minisat::Solver::Watcher,_int>::clear(pvVar11,true);
      }
      local_a8 = (int)mkLit(cls._4_4_,false);
      local_a4 = operator~((Lit)local_a8);
      pvVar11 = OccLists<Minisat::Lit,_Minisat::vec<Minisat::Solver::Watcher,_int>,_Minisat::Solver::WatcherDeleted,_Minisat::MkIndexLit>
                ::operator[](&(this->super_Solver).watches,&local_a4);
      SVar3 = vec<Minisat::Solver::Watcher,_int>::size(pvVar11);
      if (SVar3 == 0) {
        p = mkLit(cls._4_4_,false);
        local_ac = operator~(p);
        pvVar11 = OccLists<Minisat::Lit,_Minisat::vec<Minisat::Solver::Watcher,_int>,_Minisat::Solver::WatcherDeleted,_Minisat::MkIndexLit>
                  ::operator[](&(this->super_Solver).watches,&local_ac);
        vec<Minisat::Solver::Watcher,_int>::clear(pvVar11,true);
      }
      this_local._7_1_ = backwardSubsumptionCheck(this,false);
LAB_00120e2b:
      local_70 = 1;
      vec<unsigned_int,_int>::~vec((vec<unsigned_int,_int> *)local_48);
      vec<unsigned_int,_int>::~vec((vec<unsigned_int,_int> *)&neg.sz);
      return (bool)(this_local._7_1_ & 1);
    }
    for (i_2 = 0; iVar4 = i_2,
        SVar3 = vec<unsigned_int,_int>::size((vec<unsigned_int,_int> *)local_48), iVar4 < SVar3;
        i_2 = i_2 + 1) {
      puVar8 = vec<unsigned_int,_int>::operator[]((vec<unsigned_int,_int> *)&neg.sz,local_68);
      pCVar9 = ClauseAllocator::operator[](&(this->super_Solver).ca,*puVar8);
      puVar8 = vec<unsigned_int,_int>::operator[]((vec<unsigned_int,_int> *)local_48,i_2);
      pCVar10 = ClauseAllocator::operator[](&(this->super_Solver).ca,*puVar8);
      bVar2 = merge(this,pCVar9,pCVar10,cls._4_4_,&j);
      if (bVar2) {
        iVar4 = i_1 + 1;
        i_1 = iVar4;
        SVar3 = vec<unsigned_int,_int>::size(pvVar7);
        if ((SVar3 + *(int *)&(this->super_Solver).field_0x35c < iVar4) ||
           ((this->clause_lim != -1 && (this->clause_lim < j)))) {
          this_local._7_1_ = true;
          goto LAB_00120e2b;
        }
      }
    }
    local_68 = local_68 + 1;
  } while( true );
}

Assistant:

bool SimpSolver::eliminateVar(Var v)
{
    assert(!frozen[v]);
    assert(!isEliminated(v));
    assert(value(v) == l_Undef);

    // Split the occurrences into positive and negative:
    //
    const vec<CRef>& cls = occurs.lookup(v);
    vec<CRef>        pos, neg;
    for (int i = 0; i < cls.size(); i++)
        (find(ca[cls[i]], mkLit(v)) ? pos : neg).push(cls[i]);

    // Check wether the increase in number of clauses stays within the allowed ('grow'). Moreover, no
    // clause must exceed the limit on the maximal clause size (if it is set):
    //
    int cnt         = 0;
    int clause_size = 0;

    for (int i = 0; i < pos.size(); i++)
        for (int j = 0; j < neg.size(); j++)
            if (merge(ca[pos[i]], ca[neg[j]], v, clause_size) && 
                (++cnt > cls.size() + grow || (clause_lim != -1 && clause_size > clause_lim)))
                return true;

    // Delete and store old clauses:
    eliminated[v] = true;
    setDecisionVar(v, false);
    eliminated_vars++;

    if (pos.size() > neg.size()){
        for (int i = 0; i < neg.size(); i++)
            mkElimClause(elimclauses, v, ca[neg[i]]);
        mkElimClause(elimclauses, mkLit(v));
    }else{
        for (int i = 0; i < pos.size(); i++)
            mkElimClause(elimclauses, v, ca[pos[i]]);
        mkElimClause(elimclauses, ~mkLit(v));
    }

    for (int i = 0; i < cls.size(); i++)
        removeClause(cls[i]); 

    // Produce clauses in cross product:
    vec<Lit>& resolvent = add_tmp;
    for (int i = 0; i < pos.size(); i++)
        for (int j = 0; j < neg.size(); j++)
            if (merge(ca[pos[i]], ca[neg[j]], v, resolvent) && !addClause_(resolvent))
                return false;

    // Free occurs list for this variable:
    occurs[v].clear(true);
    
    // Free watchers lists for this variable, if possible:
    if (watches[ mkLit(v)].size() == 0) watches[ mkLit(v)].clear(true);
    if (watches[~mkLit(v)].size() == 0) watches[~mkLit(v)].clear(true);

    return backwardSubsumptionCheck();
}